

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> __thiscall
wabt::
MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location>
          (wabt *this,unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *args
          ,Location *args_1)

{
  GlobalImport *pGVar1;
  size_type sVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  
  puVar5 = (undefined8 *)operator_new(0x48);
  pGVar1 = (args->_M_t).
           super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>._M_t.
           super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
           super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl;
  (args->_M_t).super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
  super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl = (GlobalImport *)0x0;
  puVar5[1] = 0;
  puVar5[2] = 0;
  sVar2 = (args_1->filename).size_;
  sVar3 = (args_1->field_1).field_1.offset;
  uVar4 = *(undefined8 *)((long)&args_1->field_1 + 8);
  puVar5[3] = (args_1->filename).data_;
  puVar5[4] = sVar2;
  puVar5[5] = sVar3;
  puVar5[6] = uVar4;
  *(undefined4 *)(puVar5 + 7) = 2;
  *puVar5 = &PTR__ImportModuleField_013e1518;
  puVar5[8] = pGVar1;
  *(undefined8 **)this = puVar5;
  return (__uniq_ptr_data<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}